

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int64_t av1_rd_pick_intra_sby_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,int64_t best_rd,PICK_MODE_CONTEXT *ctx)

{
  MB_MODE_INFO *left_mi_00;
  undefined8 uVar1;
  MB_MODE_INFO *pMVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  INTRA_MODE_SPEED_FEATURES *intra_sf_00;
  AV1_COMP *in_RCX;
  MACROBLOCK *in_RDX;
  MACROBLOCK *in_RSI;
  int16_t *in_RDI;
  MACROBLOCK *in_R8;
  AV1_COMP *in_R9;
  double dVar8;
  BLOCK_SIZE in_stack_00000008;
  MACROBLOCK *in_stack_00000010;
  AV1_COMP *in_stack_00000018;
  uint8_t *color_map_src_1;
  uint8_t *color_map_src;
  int mode_idx_1;
  uint8_t *color_map_dst;
  int block_height;
  int block_width;
  int best_mode_idx;
  int txfm_search_done;
  int model_rd_index_for_pruning;
  int64_t this_model_rd;
  TX_SIZE tx_size;
  int luma_delta_angle;
  int64_t this_rd;
  int64_t this_distortion;
  int is_diagonal_mode;
  int s;
  int this_rate_tokenonly;
  int this_rate;
  RD_STATS this_rd_stats;
  int mode_idx;
  int j;
  int i_1;
  int64_t intra_modes_rd_cost [13] [9];
  int i;
  int64_t top_intra_model_rd [4];
  int max_winner_mode_count;
  MB_MODE_INFO best_mbmi;
  int is_chroma;
  float thresh [4];
  INTRA_MODE_SPEED_FEATURES *intra_sf;
  int left_ctx;
  int above_ctx;
  PREDICTION_MODE L;
  PREDICTION_MODE A;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  uint8_t *best_palette_color_map;
  int try_palette;
  PALETTE_MODE_INFO *pmi;
  IntraModeCfg *intra_mode_cfg;
  int *bmode_costs;
  int beat_best_rd;
  uint8_t directional_mode_skip_mask [13];
  int is_directional_mode;
  int64_t best_model_rd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  uint8_t *in_stack_00004240;
  MB_MODE_INFO *in_stack_00004248;
  int in_stack_00004250;
  BLOCK_SIZE in_stack_00004257;
  MACROBLOCK *in_stack_00004258;
  AV1_COMP *in_stack_00004260;
  int64_t *in_stack_000042a0;
  int *in_stack_000042a8;
  int *in_stack_000042b0;
  int64_t *in_stack_000042b8;
  uint8_t *in_stack_000042c0;
  int *in_stack_000042c8;
  PICK_MODE_CONTEXT *in_stack_000042d0;
  uint8_t *in_stack_000042d8;
  uint8_t *in_stack_000042e0;
  MACROBLOCK *in_stack_fffffffffffff970;
  AV1_COMP *in_stack_fffffffffffff978;
  undefined4 uVar9;
  MACROBLOCK *in_stack_fffffffffffff980;
  AV1_COMP *in_stack_fffffffffffff988;
  undefined4 uVar10;
  undefined4 local_670;
  MODE_EVAL_TYPE mode_eval_type;
  AV1_COMP *in_stack_fffffffffffff998;
  AV1_COMP *in_stack_fffffffffffff9a0;
  AV1_COMP *in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9c0;
  uint in_stack_fffffffffffff9c4;
  PALETTE_BUFFER *rd_cost_uv;
  undefined2 in_stack_fffffffffffff9d0;
  TX_SIZE in_stack_fffffffffffff9d2;
  undefined4 in_stack_fffffffffffff9d3;
  bool bVar11;
  undefined1 uVar12;
  MACROBLOCK *in_stack_fffffffffffff9d8;
  AV1_COMP *in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  AV1_COMMON *in_stack_fffffffffffff9f0;
  uint8_t *__dest;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  int in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  uint8_t *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  MACROBLOCK *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  int16_t *piVar13;
  undefined4 in_stack_fffffffffffffa30;
  BLOCK_SIZE BVar14;
  undefined4 in_stack_fffffffffffffa34;
  int local_5c8;
  int local_5c0;
  int16_t *local_5b8;
  BLOCK_SIZE local_5a0;
  int local_594;
  int local_590;
  int local_58c;
  ulong local_588 [113];
  uint8_t *in_stack_fffffffffffffe00;
  int64_t *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  AV1_COMP *in_stack_fffffffffffffe28;
  BLOCK_SIZE in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  PREDICTION_MODE in_stack_fffffffffffffe50;
  byte local_1ae;
  int64_t *in_stack_fffffffffffffe58;
  int64_t *in_stack_fffffffffffffe60;
  PICK_MODE_CONTEXT *in_stack_fffffffffffffe68;
  char local_122;
  int local_98;
  int local_84;
  AV1_PRIMARY *local_80;
  MB_MODE_INFO *local_78;
  MACROBLOCKD *local_70;
  AV1_COMP *local_68;
  MACROBLOCK *local_60;
  AV1_COMP *local_58;
  MACROBLOCK *local_50;
  MACROBLOCK *local_48;
  int16_t *local_40;
  MACROBLOCK *local_38;
  
  uVar1 = _local_670;
  local_70 = &in_RSI->e_mbd;
  local_78 = *(in_RSI->e_mbd).mi;
  local_80 = (AV1_PRIMARY *)0x7fffffffffffffff;
  local_68 = in_R9;
  local_60 = in_R8;
  local_58 = in_RCX;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  memset(&stack0xffffffffffffff6f,0,0xd);
  piVar3 = local_40;
  pMVar2 = local_78;
  local_98 = 0;
  bVar11 = false;
  if ((*(byte *)(local_40 + 0x21226) & 1) != 0) {
    iVar5 = av1_allow_palette((uint)(*(byte *)((long)local_40 + 0x3c16f) & 1),local_78->bsize);
    bVar11 = iVar5 != 0;
  }
  if (bVar11 == false) {
    rd_cost_uv = (PALETTE_BUFFER *)0x0;
  }
  else {
    rd_cost_uv = local_48->palette_buffer;
  }
  left_mi_00 = local_70->left_mbmi;
  uVar12 = bVar11;
  av1_above_block_mode(local_70->above_mbmi);
  av1_left_block_mode(left_mi_00);
  piVar4 = local_40;
  local_78->angle_delta[0] = '\0';
  intra_sf_00 = (INTRA_MODE_SPEED_FEATURES *)(local_40 + 0x305ae);
  if (*(int *)(local_40 + 0x305c4) != 0) {
    prune_intra_mode_with_hog
              ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (BLOCK_SIZE)((ulong)in_stack_fffffffffffffa28 >> 0x38),
               (BLOCK_SIZE)((ulong)in_stack_fffffffffffffa28 >> 0x30),
               (float)in_stack_fffffffffffffa28,(uint8_t *)in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa1c);
  }
  (local_78->filter_intra_mode_info).use_filter_intra = '\0';
  (pMVar2->palette_mode_info).palette_size[0] = '\0';
  mode_eval_type = (MODE_EVAL_TYPE)((ulong)_local_670 >> 0x38);
  set_mode_eval_params
            (in_stack_fffffffffffff9a0,(MACROBLOCK *)in_stack_fffffffffffff998,mode_eval_type);
  memcpy(&stack0xfffffffffffffe50,local_78,0xb0);
  zero_winner_mode_stats
            ((BLOCK_SIZE)((ulong)in_stack_fffffffffffff980 >> 0x38),(int)in_stack_fffffffffffff980,
             (WinnerModeStats *)in_stack_fffffffffffff978);
  local_48->winner_mode_count = 0;
  for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
    *(undefined8 *)(&stack0xfffffffffffffe28 + (long)iVar5 * 8) = 0x7fffffffffffffff;
  }
  for (local_58c = 0; local_58c < 0xd; local_58c = local_58c + 1) {
    for (local_590 = 0; local_590 < 9; local_590 = local_590 + 1) {
      local_588[(long)local_58c * 9 + (long)local_590] = 0x7fffffffffffffff;
    }
  }
  _local_670 = uVar1;
  for (local_594 = 0; uVar1 = _local_670,
      mode_eval_type = (MODE_EVAL_TYPE)((ulong)_local_670 >> 0x38), local_594 < 0x3d;
      local_594 = local_594 + 1) {
    set_y_mode_and_delta_angle(local_594,local_78,*(int *)(piVar4 + 0x305dc));
    in_stack_fffffffffffffa1c = (int)local_78->angle_delta[0];
    iVar6 = av1_is_diagonal_mode(local_78->mode);
    _local_670 = uVar1;
    if (((((iVar6 == 0) || ((*(byte *)((long)piVar3 + 0x426ed) & 1) != 0)) &&
         ((iVar6 = av1_is_directional_mode(local_78->mode), iVar6 == 0 ||
          ((*(byte *)(piVar3 + 0x21376) & 1) != 0)))) &&
        (((((*(byte *)((long)piVar3 + 0x426e9) & 1) != 0 && (*(int *)(piVar4 + 0x305c8) == 0)) ||
          ((local_78->mode != '\v' && (local_78->mode != '\n')))) &&
         ((((*(byte *)((long)piVar3 + 0x426e9) & 1) != 0 || (local_78->mode != '\t')) &&
          ((*(int *)(piVar4 + 0x305c8) == 0 ||
           ((*(int *)(piVar4 + 0x305cc) != 0 || (local_78->mode != '\t')))))))))) &&
       ((((*(byte *)(piVar3 + 0x21375) & 1) != 0 || (local_78->mode != '\f')) &&
        ((local_48->use_mb_mode_cache == 0 || (local_78->mode == local_48->mb_mode_cache->mode))))))
    {
      local_84 = av1_is_directional_mode(local_78->mode);
      if ((((local_84 == 0) || ((&stack0xffffffffffffff6f)[local_78->mode] == '\0')) &&
          ((local_84 == 0 ||
           (((iVar6 = av1_use_angle_delta(in_stack_00000008), iVar6 != 0 &&
             ((*(byte *)(piVar3 + 0x21377) & 1) != 0)) || (in_stack_fffffffffffffa1c == 0)))))) &&
         (((intra_sf_00->intra_y_mode_mask[""[in_stack_00000008]] & 1 << (local_78->mode & 0x1f)) !=
           0 && (iVar6 = prune_luma_odd_delta_angles_using_rd_cost
                                   ((MB_MODE_INFO *)in_stack_fffffffffffff988,
                                    (int64_t *)in_stack_fffffffffffff980,
                                    (int64_t)in_stack_fffffffffffff978,
                                    (int)((ulong)in_stack_fffffffffffff970 >> 0x20)), iVar6 == 0))))
      {
        if (""[in_stack_00000008] < 4) {
          in_stack_fffffffffffff9c4 = (uint)""[in_stack_00000008];
        }
        else {
          in_stack_fffffffffffff9c4 = 3;
        }
        in_stack_fffffffffffffa18 =
             CONCAT13((char)in_stack_fffffffffffff9c4,(int3)in_stack_fffffffffffffa18);
        in_stack_fffffffffffffa10 =
             (uint8_t *)
             intra_model_rd((AV1_COMMON *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                            CONCAT13(uVar12,(int3)((uint)in_stack_fffffffffffff9d3 >> 8)),
                            (BLOCK_SIZE)in_stack_fffffffffffff9d3,in_stack_fffffffffffff9d2,
                            (int)((ulong)rd_cost_uv >> 0x20));
        in_stack_fffffffffffffa0c = get_model_rd_index_for_pruning(local_48,intra_sf_00);
        iVar6 = prune_intra_y_mode((int64_t)in_stack_fffffffffffffa10,
                                   (int64_t *)&stack0xffffffffffffff80,
                                   (int64_t *)&stack0xfffffffffffffe28,*(int *)(piVar4 + 0x305d8),
                                   in_stack_fffffffffffffa0c);
        if (iVar6 == 0) {
          av1_pick_uniform_tx_size_type_yrd
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                     (RD_STATS *)
                     CONCAT17(uVar12,CONCAT43(in_stack_fffffffffffff9d3,
                                              CONCAT12(in_stack_fffffffffffff9d2,
                                                       in_stack_fffffffffffff9d0))),
                     (BLOCK_SIZE)((ulong)rd_cost_uv >> 0x38),
                     CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
          local_5c8 = local_5c0;
          if (local_5c0 != 0x7fffffff) {
            piVar13 = local_5b8;
            BVar14 = local_5a0;
            if ((local_70->lossless[(byte)*(undefined2 *)&local_78->field_0xa7 & 7] == 0) &&
               (iVar6 = block_signals_txsize(local_78->bsize), iVar6 != 0)) {
              local_5c8 = tx_size_cost((MACROBLOCK *)in_stack_fffffffffffff988,
                                       (BLOCK_SIZE)((ulong)in_stack_fffffffffffff980 >> 0x38),
                                       (TX_SIZE)((ulong)in_stack_fffffffffffff980 >> 0x30));
              local_5c8 = local_5c0 - local_5c8;
            }
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffff988 >> 0x20);
            uVar9 = (undefined4)((ulong)in_stack_fffffffffffff978 >> 0x20);
            in_stack_fffffffffffff9c0 = local_5c0;
            iVar6 = intra_mode_info_cost_y
                              ((AV1_COMP *)
                               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                               (MACROBLOCK *)
                               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                               (MB_MODE_INFO *)in_stack_fffffffffffff9f0,
                               (BLOCK_SIZE)((uint)in_stack_fffffffffffff9ec >> 0x18),
                               in_stack_fffffffffffff9e8,
                               (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
            iVar6 = in_stack_fffffffffffff9c0 + iVar6;
            in_stack_fffffffffffff980 =
                 (MACROBLOCK *)
                 (((long)iVar6 * (long)local_48->rdmult + 0x100 >> 9) + (long)piVar13 * 0x80);
            if (((char)local_40[0x213b8] == '\x02') &&
               (in_stack_fffffffffffff980 != (MACROBLOCK *)0x7fffffffffffffff)) {
              dVar8 = intra_rd_variance_factor
                                (in_stack_fffffffffffff9a8,(MACROBLOCK *)in_stack_fffffffffffff9a0,
                                 (BLOCK_SIZE)((ulong)in_stack_fffffffffffff998 >> 0x38));
              in_stack_fffffffffffff980 =
                   (MACROBLOCK *)(long)((double)(long)in_stack_fffffffffffff980 * dVar8);
            }
            local_588[(ulong)local_78->mode * 9 + (long)(in_stack_fffffffffffffa1c + 4)] =
                 (ulong)in_stack_fffffffffffff980;
            in_stack_fffffffffffffa08 = 1;
            in_stack_fffffffffffff970 = (MACROBLOCK *)0x0;
            in_stack_fffffffffffff978 = (AV1_COMP *)CONCAT44(uVar9,(uint)in_stack_00000008);
            in_stack_fffffffffffff988 =
                 (AV1_COMP *)CONCAT44(uVar10,(uint)*(byte *)(local_40 + 0x30620));
            _local_670 = CONCAT44((int)((ulong)uVar1 >> 0x20),1);
            in_stack_fffffffffffffa20 = in_stack_fffffffffffff980;
            store_winner_mode_stats
                      (in_stack_fffffffffffff9f0,
                       (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (MB_MODE_INFO *)in_stack_fffffffffffff9e0,
                       (RD_STATS *)in_stack_fffffffffffff9d8,
                       (RD_STATS *)
                       CONCAT17(uVar12,CONCAT43(in_stack_fffffffffffff9d3,
                                                CONCAT12(in_stack_fffffffffffff9d2,
                                                         in_stack_fffffffffffff9d0))),
                       (RD_STATS *)rd_cost_uv,(THR_MODES)in_stack_fffffffffffffa00,
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffa0c,1),
                       (BLOCK_SIZE)in_stack_fffffffffffffa10,
                       CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                       (int)in_stack_fffffffffffff980,(int)piVar13);
            if ((long)in_stack_fffffffffffffa20 < (long)in_stack_00000010) {
              memcpy(&stack0xfffffffffffffe50,local_78,0xb0);
              in_stack_00000010 = in_stack_fffffffffffffa20;
              local_98 = 1;
              *(int *)&local_50->plane[0].src_diff = iVar6;
              *(BLOCK_SIZE *)&local_58->ppi = (undefined1)local_5c8;
              *(undefined1 *)((long)&local_58->ppi + 1) = local_5c8._1_1_;
              *(undefined1 *)((long)&local_58->ppi + 2) = local_5c8._2_1_;
              *(undefined1 *)((long)&local_58->ppi + 3) = local_5c8._3_1_;
              local_60->plane[0].src_diff = piVar13;
              ((MB_MODE_INFO *)&local_68->ppi)->bsize = BVar14;
              in_stack_fffffffffffffa20 = in_stack_00000010;
              memcpy(*(void **)((in_stack_00000018->enc_quant_dequant_params).quants.y_quant[0x10] +
                               4),(local_48->txfm_search_info).blk_skip,
                     (long)*(int *)(in_stack_00000018->enc_quant_dequant_params).quants.y_quant
                                   [0x19]);
              memcpy(*(void **)((in_stack_00000018->enc_quant_dequant_params).quants.y_quant[0x18] +
                               4),local_70->tx_type_map,
                     (long)*(int *)(in_stack_00000018->enc_quant_dequant_params).quants.y_quant
                                   [0x19]);
            }
          }
        }
      }
    }
  }
  if (bVar11 != false) {
    in_stack_fffffffffffff9a0 =
         *(AV1_COMP **)((in_stack_00000018->enc_quant_dequant_params).quants.y_quant[0x10] + 4);
    mode_eval_type = (MODE_EVAL_TYPE)((ulong)&stack0xffffffffffffff68 >> 0x38);
    in_stack_fffffffffffff980 = local_60;
    in_stack_fffffffffffff988 = local_68;
    in_stack_fffffffffffff998 = in_stack_00000018;
    av1_rd_pick_palette_intra_sby
              (in_stack_00004260,in_stack_00004258,in_stack_00004257,in_stack_00004250,
               in_stack_00004248,in_stack_00004240,in_stack_000042a0,in_stack_000042a8,
               in_stack_000042b0,in_stack_000042b8,in_stack_000042c0,in_stack_000042c8,
               in_stack_000042d0,in_stack_000042d8,in_stack_000042e0);
    in_stack_fffffffffffff970 = local_50;
    in_stack_fffffffffffff978 = local_58;
  }
  if ((local_98 != 0) &&
     (iVar6 = av1_filter_intra_allowed_bsize((AV1_COMMON *)(local_40 + 0x1dfc0),in_stack_00000008),
     iVar6 != 0)) {
    in_stack_fffffffffffff980 = (MACROBLOCK *)&stack0x00000010;
    in_stack_fffffffffffff988 = (AV1_COMP *)&stack0xffffffffffffff80;
    in_stack_fffffffffffff970 =
         (MACROBLOCK *)((ulong)in_stack_fffffffffffff970 & 0xffffffff00000000);
    in_stack_fffffffffffff978 =
         (AV1_COMP *)CONCAT44((int)((ulong)in_stack_fffffffffffff978 >> 0x20),(uint)local_1ae);
    mode_eval_type = (MODE_EVAL_TYPE)((ulong)in_stack_00000018 >> 0x38);
    iVar5 = rd_pick_filter_intra_sby
                      (in_stack_fffffffffffffe28,
                       (MACROBLOCK *)CONCAT44(iVar5,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                       ,in_stack_fffffffffffffe00,in_stack_fffffffffffffe40,
                       in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    if (iVar5 != 0) {
      memcpy(&stack0xfffffffffffffe50,local_78,0xb0);
    }
  }
  BVar14 = (BLOCK_SIZE)((ulong)in_stack_fffffffffffff9d8 >> 0x38);
  if (local_98 == 0) {
    local_38 = (MACROBLOCK *)0x7fffffffffffffff;
  }
  else {
    if ((char)local_40[0x30620] == '\0') {
      iVar5 = is_winner_mode_processing_enabled
                        (in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                         (MB_MODE_INFO *)in_stack_fffffffffffff978,
                         (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
      if (iVar5 != 0) {
        set_mode_eval_params
                  (in_stack_fffffffffffff9a0,(MACROBLOCK *)in_stack_fffffffffffff998,mode_eval_type)
        ;
        memcpy(local_78,&stack0xfffffffffffffe50,0xb0);
        intra_block_yrd((AV1_COMP *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                        (MACROBLOCK *)in_stack_fffffffffffff9e0,BVar14,
                        (int *)CONCAT17(uVar12,CONCAT43(in_stack_fffffffffffff9d3,
                                                        CONCAT12(in_stack_fffffffffffff9d2,
                                                                 in_stack_fffffffffffff9d0))),
                        (int64_t *)rd_cost_uv,
                        (int *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                        (int *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                        (int64_t *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                        in_stack_fffffffffffffa10,
                        (MB_MODE_INFO *)
                        CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                        (PICK_MODE_CONTEXT *)in_stack_fffffffffffffa20);
      }
    }
    else {
      iVar5 = 0;
      __dest = local_70->plane[0].color_index_map;
      av1_get_block_dimensions
                (in_stack_00000008,0,local_70,(int *)&stack0xfffffffffffffa00,
                 (int *)&stack0xfffffffffffff9fc,(int *)0x0,(int *)0x0);
      for (iVar6 = 0; iVar6 < local_48->winner_mode_count; iVar6 = iVar6 + 1) {
        memcpy(local_78,local_48->winner_mode_stats + iVar6,0xb0);
        iVar7 = is_winner_mode_processing_enabled
                          (in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                           (MB_MODE_INFO *)in_stack_fffffffffffff978,
                           (int)((ulong)in_stack_fffffffffffff970 >> 0x20));
        if (iVar7 != 0) {
          if ((local_78->palette_mode_info).palette_size[0] != '\0') {
            in_stack_fffffffffffff9e0 =
                 (AV1_COMP *)local_48->winner_mode_stats[iVar6].color_index_map;
            memcpy(__dest,in_stack_fffffffffffff9e0,
                   (long)(in_stack_fffffffffffffa00 * in_stack_fffffffffffff9fc));
          }
          set_mode_eval_params
                    (in_stack_fffffffffffff9a0,(MACROBLOCK *)in_stack_fffffffffffff998,
                     mode_eval_type);
          in_stack_fffffffffffff970 = local_60;
          in_stack_fffffffffffff980 = (MACROBLOCK *)&stack0xfffffffffffffe50;
          in_stack_fffffffffffff978 = local_68;
          in_stack_fffffffffffff988 = in_stack_00000018;
          iVar7 = intra_block_yrd((AV1_COMP *)CONCAT44(iVar6,in_stack_fffffffffffff9e8),
                                  (MACROBLOCK *)in_stack_fffffffffffff9e0,
                                  (BLOCK_SIZE)((ulong)in_stack_fffffffffffff9d8 >> 0x38),
                                  (int *)CONCAT17(uVar12,CONCAT43(in_stack_fffffffffffff9d3,
                                                                  CONCAT12(in_stack_fffffffffffff9d2
                                                                           ,
                                                  in_stack_fffffffffffff9d0))),(int64_t *)rd_cost_uv
                                  ,(int *)CONCAT44(in_stack_fffffffffffff9c4,
                                                   in_stack_fffffffffffff9c0),
                                  (int *)CONCAT44(iVar5,in_stack_fffffffffffffa00),
                                  (int64_t *)
                                  CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                                  in_stack_fffffffffffffa10,
                                  (MB_MODE_INFO *)
                                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                  (PICK_MODE_CONTEXT *)in_stack_fffffffffffffa20);
          if (iVar7 != 0) {
            iVar5 = iVar6;
          }
        }
      }
      if (local_122 != '\0') {
        memcpy(__dest,local_48->winner_mode_stats[iVar5].color_index_map,
               (long)(in_stack_fffffffffffffa00 * in_stack_fffffffffffff9fc));
      }
    }
    memcpy(local_78,&stack0xfffffffffffffe50,0xb0);
    memcpy(local_70->tx_type_map,
           *(void **)((in_stack_00000018->enc_quant_dequant_params).quants.y_quant[0x18] + 4),
           (long)*(int *)(in_stack_00000018->enc_quant_dequant_params).quants.y_quant[0x19]);
    local_38 = in_stack_00000010;
  }
  return (int64_t)local_38;
}

Assistant:

int64_t av1_rd_pick_intra_sby_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                   int *rate, int *rate_tokenonly,
                                   int64_t *distortion, uint8_t *skippable,
                                   BLOCK_SIZE bsize, int64_t best_rd,
                                   PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int64_t best_model_rd = INT64_MAX;
  int is_directional_mode;
  uint8_t directional_mode_skip_mask[INTRA_MODES] = { 0 };
  // Flag to check rd of any intra mode is better than best_rd passed to this
  // function
  int beat_best_rd = 0;
  const int *bmode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  uint8_t *best_palette_color_map =
      try_palette ? x->palette_buffer->best_palette_color_map : NULL;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];

  mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  if (intra_sf->intra_pruning_with_hog) {
    // Less aggressive thresholds are used here than those used in inter frame
    // encoding in av1_handle_intra_y_mode() because we want key frames/intra
    // frames to have higher quality.
    const float thresh[4] = { -1.2f, -1.2f, -0.6f, 0.4f };
    const int is_chroma = 0;
    prune_intra_mode_with_hog(x, bsize, cpi->common.seq_params->sb_size,
                              thresh[intra_sf->intra_pruning_with_hog - 1],
                              directional_mode_skip_mask, is_chroma);
  }
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  pmi->palette_size[0] = 0;

  // Set params for mode evaluation
  set_mode_eval_params(cpi, x, MODE_EVAL);

  MB_MODE_INFO best_mbmi = *mbmi;
  const int max_winner_mode_count =
      winner_mode_count_allowed[cpi->sf.winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;

  // Searches the intra-modes except for intrabc, palette, and filter_intra.
  int64_t top_intra_model_rd[TOP_INTRA_MODEL_COUNT];
  for (int i = 0; i < TOP_INTRA_MODEL_COUNT; i++) {
    top_intra_model_rd[i] = INT64_MAX;
  }

  // Initialize the rdcost corresponding to all the directional and
  // non-directional intra modes.
  // 1. For directional modes, it stores the rdcost values for delta angles -4,
  // -3, ..., 3, 4.
  // 2. The rdcost value for luma_delta_angle is stored at index
  // luma_delta_angle + MAX_ANGLE_DELTA + 1.
  // 3. The rdcost values for fictitious/nonexistent luma_delta_angle -4 and 4
  // (array indices 0 and 8) are always set to INT64_MAX (the initial value).
  int64_t intra_modes_rd_cost[INTRA_MODE_END]
                             [SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY];
  for (int i = 0; i < INTRA_MODE_END; i++) {
    for (int j = 0; j < SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY; j++) {
      intra_modes_rd_cost[i][j] = INT64_MAX;
    }
  }

  for (int mode_idx = INTRA_MODE_START; mode_idx < LUMA_MODE_COUNT;
       ++mode_idx) {
    set_y_mode_and_delta_angle(mode_idx, mbmi,
                               intra_sf->prune_luma_odd_delta_angles_in_intra);
    RD_STATS this_rd_stats;
    int this_rate, this_rate_tokenonly, s;
    int is_diagonal_mode;
    int64_t this_distortion, this_rd;
    const int luma_delta_angle = mbmi->angle_delta[PLANE_TYPE_Y];

    is_diagonal_mode = av1_is_diagonal_mode(mbmi->mode);
    if (is_diagonal_mode && !intra_mode_cfg->enable_diagonal_intra) continue;
    if (av1_is_directional_mode(mbmi->mode) &&
        !intra_mode_cfg->enable_directional_intra)
      continue;

    // The smooth prediction mode appears to be more frequently picked
    // than horizontal / vertical smooth prediction modes. Hence treat
    // them differently in speed features.
    if ((!intra_mode_cfg->enable_smooth_intra ||
         intra_sf->disable_smooth_intra) &&
        (mbmi->mode == SMOOTH_H_PRED || mbmi->mode == SMOOTH_V_PRED))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && mbmi->mode == SMOOTH_PRED)
      continue;

    // The functionality of filter intra modes and smooth prediction
    // overlap. Hence smooth prediction is pruned only if all the
    // filter intra modes are enabled.
    if (intra_sf->disable_smooth_intra &&
        intra_sf->prune_filter_intra_level == 0 && mbmi->mode == SMOOTH_PRED)
      continue;
    if (!intra_mode_cfg->enable_paeth_intra && mbmi->mode == PAETH_PRED)
      continue;

    // Skip the evaluation of modes that do not match with the winner mode in
    // x->mb_mode_cache.
    if (x->use_mb_mode_cache && mbmi->mode != x->mb_mode_cache->mode) continue;

    is_directional_mode = av1_is_directional_mode(mbmi->mode);
    if (is_directional_mode && directional_mode_skip_mask[mbmi->mode]) continue;
    if (is_directional_mode &&
        !(av1_use_angle_delta(bsize) && intra_mode_cfg->enable_angle_delta) &&
        luma_delta_angle != 0)
      continue;

    // Use intra_y_mode_mask speed feature to skip intra mode evaluation.
    if (!(intra_sf->intra_y_mode_mask[max_txsize_lookup[bsize]] &
          (1 << mbmi->mode)))
      continue;

    if (prune_luma_odd_delta_angles_using_rd_cost(
            mbmi, intra_modes_rd_cost[mbmi->mode], best_rd,
            intra_sf->prune_luma_odd_delta_angles_in_intra))
      continue;

    const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
    const int64_t this_model_rd =
        intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

    const int model_rd_index_for_pruning =
        get_model_rd_index_for_pruning(x, intra_sf);

    if (prune_intra_y_mode(this_model_rd, &best_model_rd, top_intra_model_rd,
                           intra_sf->top_intra_model_count_allowed,
                           model_rd_index_for_pruning))
      continue;

    // Builds the actual prediction. The prediction from
    // model_intra_yrd_and_prune was just an estimation that did not take into
    // account the effect of txfm pipeline, so we need to redo it for real
    // here.
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &this_rd_stats, bsize, best_rd);
    this_rate_tokenonly = this_rd_stats.rate;
    this_distortion = this_rd_stats.dist;
    s = this_rd_stats.skip_txfm;

    if (this_rate_tokenonly == INT_MAX) continue;

    if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
      // av1_pick_uniform_tx_size_type_yrd above includes the cost of the
      // tx_size in the tokenonly rate, but for intra blocks, tx_size is always
      // coded (prediction granularity), so we account for it in the full rate,
      // not the tokenonly rate.
      this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
    }
    this_rate =
        this_rd_stats.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
    this_rd = RDCOST(x->rdmult, this_rate, this_distortion);

    // Visual quality adjustment based on recon vs source variance.
    if ((cpi->oxcf.mode == ALLINTRA) && (this_rd != INT64_MAX)) {
      this_rd = (int64_t)(this_rd * intra_rd_variance_factor(cpi, x, bsize));
    }

    intra_modes_rd_cost[mbmi->mode][luma_delta_angle + MAX_ANGLE_DELTA + 1] =
        this_rd;

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, NULL, NULL, NULL, 0, NULL, bsize, this_rd,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      // Setting beat_best_rd flag because current mode rd is better than
      // best_rd passed to this function
      beat_best_rd = 1;
      *rate = this_rate;
      *rate_tokenonly = this_rate_tokenonly;
      *distortion = this_distortion;
      *skippable = s;
      memcpy(ctx->blk_skip, x->txfm_search_info.blk_skip,
             sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  // Searches palette
  if (try_palette) {
    av1_rd_pick_palette_intra_sby(
        cpi, x, bsize, bmode_costs[DC_PRED], &best_mbmi, best_palette_color_map,
        &best_rd, rate, rate_tokenonly, distortion, skippable, &beat_best_rd,
        ctx, ctx->blk_skip, ctx->tx_type_map);
  }

  // Searches filter_intra
  if (beat_best_rd && av1_filter_intra_allowed_bsize(&cpi->common, bsize)) {
    if (rd_pick_filter_intra_sby(cpi, x, rate, rate_tokenonly, distortion,
                                 skippable, bsize, bmode_costs[DC_PRED],
                                 best_mbmi.mode, &best_rd, &best_model_rd,
                                 ctx)) {
      best_mbmi = *mbmi;
    }
  }

  // No mode is identified with less rd value than best_rd passed to this
  // function. In such cases winner mode processing is not necessary and return
  // best_rd as INT64_MAX to indicate best mode is not identified
  if (!beat_best_rd) return INT64_MAX;

  // In multi-winner mode processing, perform tx search for few best modes
  // identified during mode evaluation. Winner mode processing uses best tx
  // configuration for tx search.
  if (cpi->sf.winner_mode_sf.multi_winner_mode_type) {
    int best_mode_idx = 0;
    int block_width, block_height;
    uint8_t *color_map_dst = xd->plane[PLANE_TYPE_Y].color_index_map;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);

    for (int mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++) {
      *mbmi = x->winner_mode_stats[mode_idx].mbmi;
      if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
        // Restore color_map of palette mode before winner mode processing
        if (mbmi->palette_mode_info.palette_size[0] > 0) {
          uint8_t *color_map_src =
              x->winner_mode_stats[mode_idx].color_index_map;
          memcpy(color_map_dst, color_map_src,
                 block_width * block_height * sizeof(*color_map_src));
        }
        // Set params for winner mode evaluation
        set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);

        // Winner mode processing
        // If previous searches use only the default tx type/no R-D optimization
        // of quantized coeffs, do an extra search for the best tx type/better
        // R-D optimization of quantized coeffs
        if (intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                            rate_tokenonly, distortion, skippable, &best_mbmi,
                            ctx))
          best_mode_idx = mode_idx;
      }
    }
    // Copy color_map of palette mode for final winner mode
    if (best_mbmi.palette_mode_info.palette_size[0] > 0) {
      uint8_t *color_map_src =
          x->winner_mode_stats[best_mode_idx].color_index_map;
      memcpy(color_map_dst, color_map_src,
             block_width * block_height * sizeof(*color_map_src));
    }
  } else {
    // If previous searches use only the default tx type/no R-D optimization of
    // quantized coeffs, do an extra search for the best tx type/better R-D
    // optimization of quantized coeffs
    if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
      // Set params for winner mode evaluation
      set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);
      *mbmi = best_mbmi;
      intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                      rate_tokenonly, distortion, skippable, &best_mbmi, ctx);
    }
  }
  *mbmi = best_mbmi;
  av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
  return best_rd;
}